

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiWindow **ppIVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 != (ctx->Windows).Size; i_00 = i_00 + 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,i_00);
    (*ppIVar1)->SettingsOffset = -1;
  }
  ImVector<char>::clear(&(ctx->SettingsWindows).Buf);
  return;
}

Assistant:

static void WindowSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
        g.Windows[i]->SettingsOffset = -1;
    g.SettingsWindows.clear();
}